

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

ssize_t __thiscall HttpConn::read(HttpConn *this,int __fd,void *__buf,size_t __nbytes)

{
  EventLoop *pEVar1;
  int iVar2;
  StatusCode code;
  ssize_t sVar3;
  ssize_t extraout_RAX;
  ssize_t sVar4;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  pointer pcVar5;
  pointer pcVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  int __fd_00;
  pointer buff;
  Functor *this_00;
  long lVar7;
  Functor local_98;
  Functor local_78;
  Functor local_58;
  _Bind<void_(HttpConn::*(HttpConn_*))()> local_38;
  
  pcVar5 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar6 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)this->read_idx_;
  if ((long)pcVar6 - (long)pcVar5 == lVar7) {
    std::vector<char,_std::allocator<char>_>::resize
              (&this->readBuff_,((long)pcVar6 - (long)pcVar5) * 2);
    pcVar5 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar6 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar7 = (long)this->read_idx_;
  }
  buff = pcVar5 + lVar7;
  pcVar5 = pcVar5 + lVar7;
  sVar3 = readn(this->fd_,buff,(long)pcVar6 - (long)pcVar5);
  __fd_00 = (int)buff;
  iVar2 = (int)sVar3;
  local_38._M_bound_args.super__Tuple_impl<0UL,_HttpConn_*>.super__Head_base<0UL,_HttpConn_*,_false>
  ._M_head_impl = (_Tuple_impl<0UL,_HttpConn_*>)(_Tuple_impl<0UL,_HttpConn_*>)this;
  if (iVar2 < 0) {
    std::__cxx11::string::assign((char *)&this->body_);
    code = BadRequest;
LAB_001201b5:
    handleResponse(this,code);
    sVar4 = extraout_RAX;
  }
  else if (iVar2 == 0) {
    this->connStatus_ = Disconnecting;
    __buf_00 = extraout_RDX;
    if (this->parseState_ != Finished) {
      std::__cxx11::string::assign((char *)&this->body_);
      __fd_00 = 400;
      handleResponse(this,BadRequest);
      __buf_00 = extraout_RDX_00;
    }
    if (this->writeable_ != true) {
      pEVar1 = this->loop_;
      local_38._M_f = (offset_in_HttpConn_to_subr)close;
      local_38._8_8_ = 0;
      std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
                ((function<void()> *)&local_98,&local_38);
      EventLoop::runInLoop(pEVar1,&local_98);
      this_00 = &local_98;
      goto LAB_001202e4;
    }
    sVar4 = write(this,__fd_00,__buf_00,(size_t)pcVar5);
  }
  else {
    this->read_idx_ = this->read_idx_ + iVar2;
    code = parseRequest(this);
    if (code != Wait) goto LAB_001201b5;
    Channel::update((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    sVar4 = extraout_RAX_00;
  }
  if (this->connStatus_ != Connected) {
    return sVar4;
  }
  pEVar1 = this->loop_;
  iVar2 = this->id_;
  if (this->linger_ == true) {
    local_38._M_f = (offset_in_HttpConn_to_subr)close;
    local_38._8_8_ = 0;
    std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
              ((function<void()> *)&local_78,&local_38);
    EventLoop::addTimer(pEVar1,iVar2,90000,&local_78);
    this_00 = &local_78;
  }
  else {
    local_38._M_f = (offset_in_HttpConn_to_subr)close;
    local_38._8_8_ = 0;
    std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
              ((function<void()> *)&local_58,&local_38);
    EventLoop::addTimer(pEVar1,iVar2,8000,&local_58);
    this_00 = &local_58;
  }
LAB_001202e4:
  std::_Function_base::~_Function_base(&this_00->super__Function_base);
  return extraout_RAX_01;
}

Assistant:

void HttpConn::read() {
    if (readBuff_.size() - read_idx_ == 0) readBuff_.resize(readBuff_.size() * 2);
    int readBytes = readn(fd_, readBuff_.data() + read_idx_, readBuff_.size() - read_idx_);
    if (readBytes < 0) {
        body_ = "Read Socket Error!";
        handleResponse(BadRequest);
    } else if (readBytes == 0) {
        connStatus_ = Disconnecting;
        if (parseState_ != Finished) {
            body_ = "Request is not complete!";
            handleResponse(BadRequest);
        }
        if (writeable_) 
            write();
        else {
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
        
    }
    else {
        read_idx_ += readBytes;
        StatusCode c = parseRequest();
        if (c != Wait) {
            handleResponse(c);
        } else {
            channel_->update();
        }
    }
    
    if (connStatus_ == Connected) {
        if (linger_) 
            loop_->addTimer(id_, keepAliveTimeout, std::bind(&HttpConn::close, this)); 
        else 
            loop_->addTimer(id_, defaultTimeout, std::bind(&HttpConn::close, this));   
    }
    // handleConn();
}